

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata.cpp
# Opt level: O2

int64_t duckdb_nanoarrow::ArrowMetadataSizeOf(char *metadata)

{
  long lVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  
  if (metadata == (char *)0x0) {
    lVar2 = 0;
  }
  else {
    lVar2 = 4;
    lVar4 = lVar2;
    for (iVar3 = *(int *)metadata; 0 < iVar3; iVar3 = iVar3 + -1) {
      lVar5 = (long)*(int *)(metadata + lVar4);
      lVar1 = lVar5 + 4 + lVar4;
      lVar4 = lVar4 + lVar5 + (long)*(int *)(metadata + lVar1) + 8;
      lVar2 = lVar2 + lVar5 + (long)*(int *)(metadata + lVar1) + 8;
    }
  }
  return lVar2;
}

Assistant:

int64_t ArrowMetadataSizeOf(const char *metadata) {
	if (metadata == NULL) {
		return 0;
	}

	struct ArrowMetadataReader reader;
	struct ArrowStringView key;
	struct ArrowStringView value;
	ArrowMetadataReaderInit(&reader, metadata);

	int64_t size = sizeof(int32_t);
	while (ArrowMetadataReaderRead(&reader, &key, &value) == NANOARROW_OK) {
		size += sizeof(int32_t) + uint64_t(key.n_bytes) + sizeof(int32_t) + uint64_t(value.n_bytes);
	}

	return size;
}